

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_set_loss(ggml_tensor *tensor)

{
  _Bool _Var1;
  ggml_tensor *in_RDI;
  
  _Var1 = ggml_is_scalar(in_RDI);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x18f7,"GGML_ASSERT(%s) failed","ggml_is_scalar(tensor)");
  }
  if (in_RDI->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x18f8,"GGML_ASSERT(%s) failed","tensor->type == GGML_TYPE_F32");
  }
  in_RDI->flags = in_RDI->flags | 8;
  return;
}

Assistant:

void ggml_set_loss(struct ggml_tensor * tensor) {
    GGML_ASSERT(ggml_is_scalar(tensor));
    GGML_ASSERT(tensor->type == GGML_TYPE_F32);
    tensor->flags |= GGML_TENSOR_FLAG_LOSS;
}